

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCopyPixels.cpp
# Opt level: O3

void testCopyPixels(string *tempDir)

{
  double dVar1;
  char cVar2;
  ushort uVar3;
  half *phVar4;
  float fVar5;
  uint uVar6;
  int in_R8D;
  int in_R9D;
  half *phVar7;
  int x;
  long lVar8;
  int y;
  long lVar9;
  Array2D<Imath_3_2::half> ph;
  Array2D<Imath_3_2::half> local_50;
  double local_38;
  double local_30;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing fast pixel copying",0x1a);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  local_50._sizeX = 0x22f;
  local_50._sizeY = 0x173;
  phVar4 = (half *)operator_new__(0x6543a);
  lVar9 = 0;
  phVar7 = phVar4;
  local_50._data = phVar4;
  do {
    local_38 = (double)(int)lVar9 * 0.5;
    lVar8 = 0;
    do {
      local_30 = sin((double)(int)lVar8);
      dVar1 = sin(local_38);
      fVar5 = ABS((float)(dVar1 + local_30));
      uVar3 = (ushort)((uint)(float)(dVar1 + local_30) >> 0x10) & 0x8000;
      if ((uint)fVar5 < 0x38800000) {
        if ((0x33000000 < (uint)fVar5) &&
           (uVar6 = (uint)fVar5 & 0x7fffff | 0x800000, cVar2 = (char)((uint)fVar5 >> 0x17),
           uVar3 = uVar3 | (ushort)(uVar6 >> (0x7eU - cVar2 & 0x1f)),
           0x80000000 < uVar6 << (cVar2 + 0xa2U & 0x1f))) {
          uVar3 = uVar3 + 1;
        }
      }
      else if ((uint)fVar5 < 0x7f800000) {
        if ((uint)fVar5 < 0x477ff000) {
          uVar3 = (ushort)((int)fVar5 + 0x8000fff + (uint)(((uint)fVar5 >> 0xd & 1) != 0) >> 0xd) |
                  uVar3;
        }
        else {
          uVar3 = uVar3 | 0x7c00;
        }
      }
      else {
        uVar3 = uVar3 | 0x7c00;
        if (fVar5 != INFINITY) {
          uVar6 = (uint)fVar5 >> 0xd & 0x3ff;
          uVar3 = uVar3 | (ushort)uVar6 | (ushort)(uVar6 == 0);
        }
      }
      phVar7[lVar8]._h = uVar3;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0x173);
    lVar9 = lVar9 + 1;
    phVar7 = phVar7 + 0x173;
  } while (lVar9 != 0x22f);
  anon_unknown.dwarf_104492::writeCopyRead(tempDir,&local_50,0,0,in_R8D,in_R9D);
  anon_unknown.dwarf_104492::writeCopyRead(tempDir,&local_50,0,0x1d,in_R8D,in_R9D);
  anon_unknown.dwarf_104492::writeCopyRead(tempDir,&local_50,0x11,0,in_R8D,in_R9D);
  anon_unknown.dwarf_104492::writeCopyRead(tempDir,&local_50,0x11,0x1d,in_R8D,in_R9D);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ok\n",3);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  operator_delete__(phVar4);
  return;
}

Assistant:

void
testCopyPixels (const std::string& tempDir)
{
    try
    {
        cout << "Testing fast pixel copying" << endl;

        const int W  = 371;
        const int H  = 559;
        const int DX = 17;
        const int DY = 29;

        Array2D<half> ph (H, W);

        fillPixels (ph, W, H);
        writeCopyRead (tempDir, ph, W, H, 0, 0);
        writeCopyRead (tempDir, ph, W, H, 0, DY);
        writeCopyRead (tempDir, ph, W, H, DX, 0);
        writeCopyRead (tempDir, ph, W, H, DX, DY);

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}